

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_type_fracdigits(lysp_yang_ctx *ctx,lysp_type *type)

{
  ushort **ppuVar1;
  int *piVar2;
  char *pcVar3;
  ly_ctx *local_90;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  bool local_55;
  ly_stmt local_54;
  ly_bool __loop_end;
  ulonglong uStack_50;
  ly_stmt kw;
  unsigned_long_long num;
  size_t word_len;
  char *ptr;
  char *word;
  char *buf;
  lysp_type *plStack_20;
  LY_ERR ret;
  lysp_type *type_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word = (char *)0x0;
  plStack_20 = type;
  type_local = (lysp_type *)ctx;
  if (type->fraction_digits != '\0') {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_60 = (ly_ctx *)0x0;
    }
    else {
      local_60 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","fraction-digits");
    return LY_EVALID;
  }
  buf._4_4_ = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&ptr,&word,&num);
  if (buf._4_4_ == LY_SUCCESS) {
    if (((num == 0) || (*ptr == '0')) ||
       (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*ptr] & 0x800) == 0)) {
      if (type_local == (lysp_type *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = *(ly_ctx **)
                    **(undefined8 **)
                      (type_local->bases[1] + (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8
                      );
      }
      ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              num & 0xffffffff,ptr,"fraction-digits");
      buf._4_4_ = LY_EVALID;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0;
      uStack_50 = strtoull(ptr,(char **)&word_len,10);
      if (word_len - (long)ptr == num) {
        piVar2 = __errno_location();
        if ((*piVar2 == 0x22) || (0x12 < uStack_50)) {
          if (type_local == (lysp_type *)0x0) {
            local_78 = (ly_ctx *)0x0;
          }
          else {
            local_78 = *(ly_ctx **)
                        **(undefined8 **)
                          (type_local->bases[1] +
                          (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
          }
          ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                  num & 0xffffffff,ptr,"fraction-digits");
          buf._4_4_ = LY_EVALID;
        }
        else {
          plStack_20->fraction_digits = (uint8_t)uStack_50;
          buf._4_4_ = get_keyword((lysp_yang_ctx *)type_local,&local_54,&ptr,&num);
          if (buf._4_4_ == LY_SUCCESS) {
            if (local_54 == LY_STMT_SYNTAX_SEMICOLON) {
              local_55 = true;
            }
            else {
              if (local_54 != LY_STMT_SYNTAX_LEFT_BRACE) {
                if (type_local == (lysp_type *)0x0) {
                  local_80 = (ly_ctx *)0x0;
                }
                else {
                  local_80 = *(ly_ctx **)
                              **(undefined8 **)
                                (type_local->bases[1] +
                                (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(local_54);
                ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
                buf._4_4_ = LY_EVALID;
                goto LAB_001d3deb;
              }
              buf._4_4_ = get_keyword((lysp_yang_ctx *)type_local,&local_54,&ptr,&num);
              if (buf._4_4_ != LY_SUCCESS) goto LAB_001d3deb;
              local_55 = local_54 == LY_STMT_SYNTAX_RIGHT_BRACE;
            }
            while (!local_55) {
              if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
                if (type_local == (lysp_type *)0x0) {
                  local_90 = (ly_ctx *)0x0;
                }
                else {
                  local_90 = *(ly_ctx **)
                              **(undefined8 **)
                                (type_local->bases[1] +
                                (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
                }
                pcVar3 = lyplg_ext_stmt2str(local_54);
                ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"fraction-digits");
                buf._4_4_ = LY_EVALID;
                break;
              }
              buf._4_4_ = parse_ext((lysp_yang_ctx *)type_local,ptr,num,plStack_20,
                                    LY_STMT_FRACTION_DIGITS,0,&plStack_20->exts);
              if ((buf._4_4_ != LY_SUCCESS) ||
                 (buf._4_4_ = get_keyword((lysp_yang_ctx *)type_local,&local_54,&ptr,&num),
                 buf._4_4_ != LY_SUCCESS)) break;
              if (local_54 == LY_STMT_SYNTAX_RIGHT_BRACE) {
                local_55 = true;
              }
            }
          }
        }
      }
      else {
        if (type_local == (lysp_type *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = *(ly_ctx **)
                      **(undefined8 **)
                        (type_local->bases[1] +
                        (ulong)(*(int *)((long)type_local->bases + 4) - 1) * 8);
        }
        ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                num & 0xffffffff,ptr,"fraction-digits");
        buf._4_4_ = LY_EVALID;
      }
    }
  }
LAB_001d3deb:
  free(word);
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_type_fracdigits(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (type->fraction_digits) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "fraction-digits");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || (word[0] == '0') || !isdigit(word[0])) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    num = strtoull(word, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }
    if ((errno == ERANGE) || (num > LY_TYPE_DEC64_FD_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "fraction-digits");
        ret = LY_EVALID;
        goto cleanup;
    }
    type->fraction_digits = num;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, type, LY_STMT_FRACTION_DIGITS, 0, &type->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "fraction-digits");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}